

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

int If_CutCompareArea(If_Man_t *p,If_Cut_t **ppC0,If_Cut_t **ppC1)

{
  float fVar1;
  If_Cut_t *pIVar2;
  If_Cut_t *pIVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  pIVar2 = *ppC0;
  pIVar3 = *ppC1;
  fVar1 = p->fEpsilon;
  if (pIVar2->Area < pIVar3->Area - fVar1) {
    return -1;
  }
  iVar4 = 1;
  if (pIVar2->Area <= pIVar3->Area + fVar1) {
    uVar5 = *(uint *)&pIVar2->field_0x1c >> 0x18;
    uVar6 = *(uint *)&pIVar3->field_0x1c >> 0x18;
    if (uVar5 < uVar6) {
      return -1;
    }
    if (uVar5 <= uVar6) {
      iVar4 = -1;
      if (pIVar3->Delay - fVar1 <= pIVar2->Delay) {
        return (int)(fVar1 + pIVar3->Delay < pIVar2->Delay);
      }
    }
  }
  return iVar4;
}

Assistant:

int If_CutCompareArea( If_Man_t * p, If_Cut_t ** ppC0, If_Cut_t ** ppC1 )
{
    If_Cut_t * pC0 = *ppC0;
    If_Cut_t * pC1 = *ppC1;
    if ( pC0->Area < pC1->Area - p->fEpsilon )
        return -1;
    if ( pC0->Area > pC1->Area + p->fEpsilon )
        return 1;
//    if ( pC0->AveRefs > pC1->AveRefs )
//        return -1;
//    if ( pC0->AveRefs < pC1->AveRefs )
//        return 1;
    if ( pC0->nLeaves < pC1->nLeaves )
        return -1;
    if ( pC0->nLeaves > pC1->nLeaves )
        return 1;
    if ( pC0->Delay < pC1->Delay - p->fEpsilon )
        return -1;
    if ( pC0->Delay > pC1->Delay + p->fEpsilon )
        return 1;
    return 0;
}